

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string *output;
  Nonnull<char_*> pcVar3;
  Arena *arena;
  char *pcVar4;
  io *this_00;
  _Alloc_hider _Var5;
  uint64_t uVar6;
  string_view text;
  string_view text_00;
  string_view text_01;
  ErrorMaker error;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view src;
  double value_1;
  uint64_t value;
  LocationRecorder location;
  size_type *local_90 [2];
  size_type local_80 [2];
  uint64_t local_70;
  string local_68;
  LocationRecorder local_38;
  
  if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x8) !=
      (undefined1  [80])0x0) {
    RecordError(this,(ErrorMaker)ZEXT816(0x3d7a49));
    internal::ArenaStringPtr::ClearToEmpty(&(field->field_0)._impl_.default_value_);
    *(byte *)&field->field_0 = *(byte *)&field->field_0 & 0xf7;
  }
  text._M_str = "default";
  text._M_len = 7;
  bVar2 = Consume(this,text);
  if ((!bVar2) || (text_00._M_str = "=", text_00._M_len = 1, bVar2 = Consume(this,text_00), !bVar2))
  {
    return false;
  }
  LocationRecorder::Init(&local_38,field_location,field_location->source_code_info_);
  RepeatedField<int>::Add(&((local_38.location_)->field_0)._impl_.path_,7);
  LocationRecorder::RecordLegacyLocation(&local_38,&field->super_Message,DEFAULT_VALUE);
  *(byte *)&field->field_0 = *(byte *)&field->field_0 | 8;
  arena = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  output = internal::ArenaStringPtr::Mutable_abi_cxx11_
                     (&(field->field_0)._impl_.default_value_,arena);
  if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x400) ==
      (undefined1  [80])0x0) {
    std::__cxx11::string::_M_assign((string *)output);
    bVar2 = true;
    io::Tokenizer::Next(this->input_);
    goto LAB_0020280f;
  }
  switch((field->field_0)._impl_.type_) {
  case 1:
  case 2:
    text_02._M_str = "-";
    text_02._M_len = 1;
    bVar2 = TryConsume(this,text_02);
    if (bVar2) {
      std::__cxx11::string::append((char *)output);
    }
    this_00 = (io *)local_90;
    local_90[0] = (size_type *)0x0;
    bVar2 = ConsumeNumber(this,(double *)this_00,(ErrorMaker)ZEXT816(0x3d7ac3));
    if (bVar2) {
      io::SimpleDtoa_abi_cxx11_(&local_68,this_00,(double)local_90[0]);
      std::__cxx11::string::_M_append((char *)output,(ulong)local_68._M_dataplus._M_p);
      goto LAB_00202786;
    }
    goto LAB_0020280d;
  case 3:
  case 0x10:
  case 0x12:
    uVar6 = 0x7fffffffffffffff;
    goto LAB_00202554;
  case 4:
  case 6:
    uVar6 = 0xffffffffffffffff;
    goto LAB_00202698;
  case 5:
  case 0xf:
  case 0x11:
    uVar6 = 0x7fffffff;
LAB_00202554:
    text_01._M_str = "-";
    text_01._M_len = 1;
    bVar2 = TryConsume(this,text_01);
    if (bVar2) {
      std::__cxx11::string::append((char *)output);
      uVar6 = uVar6 + 1;
    }
    bVar2 = ConsumeInteger64(this,uVar6,&local_70,(ErrorMaker)ZEXT816(0x3d7a67));
    if (!bVar2) {
LAB_0020280d:
      bVar2 = false;
      goto LAB_0020280f;
    }
    paVar1 = &local_68.field_2;
    pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer(local_70,paVar1->_M_local_buf);
    local_68._M_dataplus._M_p = pcVar3 + -(long)paVar1;
    local_90[0] = local_80;
    local_68._M_string_length = (size_type)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,paVar1,pcVar3);
    std::__cxx11::string::_M_append((char *)output,(ulong)local_90[0]);
LAB_00202730:
    _Var5._M_p = (pointer)local_90[0];
    if (local_90[0] != local_80) {
LAB_00202790:
      operator_delete(_Var5._M_p,local_80[0] + 1);
    }
    break;
  case 7:
  case 0xd:
    uVar6 = 0xffffffff;
LAB_00202698:
    text_03._M_str = "-";
    text_03._M_len = 1;
    bVar2 = TryConsume(this,text_03);
    if (bVar2) {
      RecordError(this,(ErrorMaker)ZEXT816(0x3d7a91));
    }
    bVar2 = ConsumeInteger64(this,uVar6,&local_70,(ErrorMaker)ZEXT816(0x3d7a67));
    if (bVar2) {
      paVar1 = &local_68.field_2;
      pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer(local_70,paVar1->_M_local_buf);
      local_68._M_dataplus._M_p = pcVar3 + -(long)paVar1;
      local_90[0] = local_80;
      local_68._M_string_length = (size_type)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,paVar1,pcVar3);
      std::__cxx11::string::_M_append((char *)output,(ulong)local_90[0]);
      goto LAB_00202730;
    }
    goto LAB_0020280d;
  case 8:
    text_04._M_str = "true";
    text_04._M_len = 4;
    bVar2 = TryConsume(this,text_04);
    if ((!bVar2) &&
       (text_05._M_str = "false", text_05._M_len = 5, bVar2 = TryConsume(this,text_05), !bVar2)) {
      pcVar4 = "Expected \"true\" or \"false\".";
      goto LAB_00202605;
    }
    std::__cxx11::string::assign((char *)output);
    break;
  case 9:
    bVar2 = ConsumeString(this,output,(ErrorMaker)ZEXT816(0x3d7af0));
    goto LAB_00202809;
  case 10:
  case 0xb:
    pcVar4 = "Messages can\'t have default values.";
LAB_00202605:
    bVar2 = false;
    error.func_ = (_func_string_void_ptr *)0x0;
    error.field_0.error_ = pcVar4;
    RecordError(this,error);
    goto LAB_0020280f;
  case 0xc:
    pcVar4 = (char *)0x0;
    bVar2 = ConsumeString(this,output,(ErrorMaker)ZEXT816(0x3d7b19));
    if (!bVar2) goto LAB_0020280d;
    src._M_str = pcVar4;
    src._M_len = (size_t)(output->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_68,(lts_20250127 *)output->_M_string_length,src);
    std::__cxx11::string::operator=((string *)output,(string *)&local_68);
LAB_00202786:
    local_80[0] = local_68.field_2._M_allocated_capacity;
    _Var5._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) break;
    goto LAB_00202790;
  case 0xe:
    bVar2 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x3d7b2a));
LAB_00202809:
    if (bVar2 != false) break;
    goto LAB_0020280d;
  }
  bVar2 = true;
LAB_0020280f:
  LocationRecorder::~LocationRecorder(&local_38);
  return bVar2;
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field, const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    RecordError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  std::string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64_t max_value = std::numeric_limits<int64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = std::numeric_limits<int32_t>::max();
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(absl::StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64_t max_value = std::numeric_limits<uint64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = std::numeric_limits<uint32_t>::max();
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        RecordError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(absl::StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE: {
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value = 0.0;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(io::SimpleDtoa(value));
      break;
    }
    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        RecordError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file option java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value,
                       "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = absl::CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value,
                           "Expected enum identifier for field "
                           "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      RecordError("Messages can't have default values.");
      return false;
  }

  return true;
}